

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

Belief * __thiscall despot::BaseTag::Tau(BaseTag *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  ParticleBelief *pPVar6;
  ulong uVar7;
  int i;
  long lVar8;
  long lVar9;
  int j;
  ulong uVar10;
  long *plVar11;
  double dVar12;
  double local_a0;
  State *new_particle;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  
  if (Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') {
    iVar4 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    if (iVar4 != 0) {
      iVar4 = (**(code **)(*(long *)this + 0x10))(this);
      std::vector<double,_std::allocator<double>_>::vector
                (&Tau::probs,(long)iVar4,(allocator_type *)&new_particles);
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
      __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    }
  }
  plVar5 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  local_a0 = 0.0;
  uVar7 = 0;
  while( true ) {
    if ((ulong)(plVar5[1] - *plVar5 >> 3) <= uVar7) break;
    lVar8 = *(long *)(*plVar5 + uVar7 * 8);
    iVar4 = (**(code **)(*(long *)this + 0x58))(this,lVar8);
    plVar11 = (long *)(*(long *)&(this->transition_probabilities_).
                                 super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                 super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                 ._M_impl.super__Vector_impl_data + (long)action * 0x18);
    lVar9 = 0xc;
    for (uVar10 = 0; lVar3 = *plVar11, uVar10 < (ulong)(plVar11[1] - lVar3 >> 5);
        uVar10 = uVar10 + 1) {
      dVar1 = *(double *)(lVar8 + 0x18);
      dVar2 = *(double *)(lVar3 + 0xc + lVar9);
      dVar12 = (double)(**(code **)(*(long *)this + 0x68))
                                 (this,obs,(this->states_).
                                           super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [*(int *)(lVar3 + lVar9)],action);
      dVar12 = dVar12 * dVar1 * dVar2;
      local_a0 = local_a0 + dVar12;
      Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[*(int *)(lVar3 + lVar9)] =
           dVar12 + Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[*(int *)(lVar3 + lVar9)];
      lVar9 = lVar9 + 0x20;
    }
    uVar7 = uVar7 + 1;
  }
  new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar8 = 0;
  while( true ) {
    iVar4 = (**(code **)(*(long *)this + 0x10))(this);
    if (iVar4 <= lVar8) break;
    if (0.0 < Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8]) {
      new_particle = (State *)(**(code **)(*(long *)this + 0xe8))
                                        (this,(this->states_).
                                              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar8]);
      *(double *)(new_particle + 0x18) =
           Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar8] / local_a0;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                (&new_particles,&new_particle);
      Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = 0.0;
    }
    lVar8 = lVar8 + 1;
  }
  pPVar6 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_48,&new_particles);
  despot::ParticleBelief::ParticleBelief(pPVar6,&local_48,&this->super_BeliefMDP,0,0);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_48);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return (Belief *)pPVar6;
}

Assistant:

Belief* BaseTag::Tau(const Belief* belief, ACT_TYPE action, OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		TagState* state = static_cast<TagState*>(particles[i]);
		const vector<State>& distribution = transition_probabilities_[GetIndex(
			state)][action];
		for (int j = 0; j < distribution.size(); j++) {
			const State& next = distribution[j];
			double p = state->weight * next.weight
				* ObsProb(obs, *(states_[next.state_id]), action);
			probs[next.state_id] += p;
			sum += p;
		}
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			State* new_particle = Copy(states_[i]);
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}